

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddFuncs.c
# Opt level: O1

DdNode * cuddZddWeakDivF(DdManager *dd,DdNode *f,DdNode *g)

{
  uint v;
  int iVar1;
  DdHalfWord v_00;
  int iVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *n;
  DdNode *n_00;
  DdNode *g_00;
  DdNode *fd;
  DdNode *f1;
  DdNode *f0;
  DdNode *gd;
  DdNode *g1;
  DdNode *g0;
  DdNode *local_68;
  DdNode *local_60;
  DdNode *local_58;
  DdNode *local_50;
  DdNode *local_48;
  DdNode *local_40;
  DdNode *local_38;
  
  pDVar3 = dd->one;
  if (pDVar3 == g) {
    return f;
  }
  pDVar4 = dd->zero;
  if (pDVar3 == f || pDVar4 == f) {
    return pDVar4;
  }
  if (f == g) {
    return pDVar3;
  }
  pDVar3 = cuddCacheLookup2Zdd(dd,cuddZddWeakDivF,f,g);
  if (pDVar3 != (DdNode *)0x0) {
    return pDVar3;
  }
  v = f->index;
  iVar2 = dd->permZ[v];
  iVar1 = dd->permZ[g->index];
  pDVar3 = g;
  if ((iVar1 < iVar2) || (pDVar3 = f, iVar1 >> 1 <= iVar2 >> 1)) {
    v_00 = pDVar3->index;
    iVar2 = cuddZddGetCofactors3(dd,f,v_00,&local_58,&local_50,&local_68);
    if (iVar2 != 0) {
      return (DdNode *)0x0;
    }
    Cudd_Ref(local_58);
    Cudd_Ref(local_50);
    pDVar3 = local_68;
    Cudd_Ref(local_68);
    iVar2 = cuddZddGetCofactors3(dd,g,v_00,&local_40,&local_38,&local_48);
    if (iVar2 != 0) {
      Cudd_RecursiveDerefZdd(dd,local_58);
      Cudd_RecursiveDerefZdd(dd,local_50);
      n = pDVar3;
      goto LAB_0079ff2c;
    }
    local_60 = local_40;
    Cudd_Ref(local_40);
    Cudd_Ref(local_38);
    n = local_48;
    Cudd_Ref(local_48);
    pDVar5 = g;
    if ((local_38 != pDVar4) &&
       (pDVar5 = cuddZddWeakDivF(dd,local_50,local_38), pDVar5 == (DdNode *)0x0)) {
      Cudd_RecursiveDerefZdd(dd,local_58);
      Cudd_RecursiveDerefZdd(dd,local_50);
      Cudd_RecursiveDerefZdd(dd,pDVar3);
      Cudd_RecursiveDerefZdd(dd,local_60);
      pDVar3 = local_38;
      goto LAB_007a0176;
    }
    Cudd_Ref(pDVar5);
    Cudd_RecursiveDerefZdd(dd,local_50);
    Cudd_RecursiveDerefZdd(dd,local_38);
    g_00 = local_60;
    if (pDVar5 == pDVar4) {
      Cudd_RecursiveDerefZdd(dd,local_58);
      Cudd_RecursiveDerefZdd(dd,local_60);
      Cudd_RecursiveDerefZdd(dd,pDVar3);
      goto LAB_007a0289;
    }
    if (local_60 != pDVar4) {
      Cudd_RecursiveDerefZdd(dd,pDVar5);
      n_00 = cuddZddWeakDivF(dd,local_58,g_00);
      if (n_00 == (DdNode *)0x0) {
        Cudd_RecursiveDerefZdd(dd,local_58);
        Cudd_RecursiveDerefZdd(dd,g_00);
      }
      else {
        Cudd_Ref(n_00);
        Cudd_RecursiveDerefZdd(dd,local_58);
        Cudd_RecursiveDerefZdd(dd,g_00);
        if (pDVar5 == g) goto LAB_007a01a7;
        pDVar5 = cuddZddIntersect(dd,pDVar5,n_00);
        if (pDVar5 != (DdNode *)0x0) {
          Cudd_Ref(pDVar5);
          g_00 = n_00;
          goto LAB_007a012a;
        }
      }
LAB_007a0176:
      Cudd_RecursiveDerefZdd(dd,pDVar3);
      goto LAB_0079ff2c;
    }
    Cudd_RecursiveDerefZdd(dd,local_58);
LAB_007a012a:
    Cudd_RecursiveDerefZdd(dd,g_00);
    n_00 = pDVar5;
LAB_007a01a7:
    if (n_00 == pDVar4) {
      Cudd_RecursiveDerefZdd(dd,pDVar3);
      pDVar5 = n_00;
LAB_007a0289:
      Cudd_RecursiveDerefZdd(dd,n);
      cuddCacheInsert2(dd,cuddZddWeakDivF,f,g,pDVar4);
      Cudd_Deref(pDVar5);
      return pDVar4;
    }
    if (n == pDVar4) goto LAB_007a0249;
    Cudd_RecursiveDerefZdd(dd,n_00);
    n = cuddZddWeakDivF(dd,local_68,local_48);
    pDVar4 = local_48;
    if (n == (DdNode *)0x0) goto LAB_007a02b3;
    Cudd_Ref(n);
    Cudd_RecursiveDerefZdd(dd,local_68);
    Cudd_RecursiveDerefZdd(dd,local_48);
    if (n_00 == g) goto LAB_007a0259;
    n_00 = cuddZddIntersect(dd,n_00,n);
    if (n_00 == (DdNode *)0x0) goto LAB_0079ff2c;
    Cudd_Ref(n_00);
  }
  else {
    iVar2 = cuddZddGetCofactors3(dd,f,v,&local_58,&local_50,&local_68);
    if (iVar2 != 0) {
      return (DdNode *)0x0;
    }
    Cudd_Ref(local_58);
    Cudd_Ref(local_50);
    Cudd_Ref(local_68);
    pDVar3 = cuddZddWeakDivF(dd,local_58,g);
    if (pDVar3 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,local_58);
LAB_007a0070:
      Cudd_RecursiveDerefZdd(dd,local_50);
      n = local_68;
      goto LAB_0079ff2c;
    }
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDerefZdd(dd,local_58);
    pDVar4 = cuddZddWeakDivF(dd,local_50,g);
    if (pDVar4 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,local_50);
      Cudd_RecursiveDerefZdd(dd,local_68);
      n = pDVar3;
      goto LAB_0079ff2c;
    }
    Cudd_Ref(pDVar4);
    Cudd_RecursiveDerefZdd(dd,local_50);
    pDVar5 = cuddZddWeakDivF(dd,local_68,g);
    if (pDVar5 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,local_68);
      Cudd_RecursiveDerefZdd(dd,pDVar3);
      n = pDVar4;
      goto LAB_0079ff2c;
    }
    Cudd_Ref(pDVar5);
    Cudd_RecursiveDerefZdd(dd,local_68);
    n = cuddZddGetNode(dd,v | 1,pDVar4,pDVar5);
    if (n == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,pDVar3);
      local_50 = pDVar4;
      local_68 = pDVar5;
      goto LAB_007a0070;
    }
    Cudd_Ref(n);
    Cudd_RecursiveDerefZdd(dd,pDVar4);
    Cudd_RecursiveDerefZdd(dd,pDVar5);
    n_00 = cuddZddGetNode(dd,v & 0xfffffffe,pDVar3,n);
    pDVar4 = n;
    local_68 = pDVar3;
    if (n_00 == (DdNode *)0x0) {
LAB_007a02b3:
      Cudd_RecursiveDerefZdd(dd,local_68);
      n = pDVar4;
LAB_0079ff2c:
      Cudd_RecursiveDerefZdd(dd,n);
      return (DdNode *)0x0;
    }
    Cudd_Ref(n_00);
LAB_007a0249:
    Cudd_RecursiveDerefZdd(dd,pDVar3);
  }
  Cudd_RecursiveDerefZdd(dd,n);
  n = n_00;
LAB_007a0259:
  cuddCacheInsert2(dd,cuddZddWeakDivF,f,g,n);
  Cudd_Deref(n);
  return n;
}

Assistant:

DdNode  *
cuddZddWeakDivF(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    int         v, top_f, top_g, vf, vg;
    DdNode      *one = DD_ONE(dd);
    DdNode      *zero = DD_ZERO(dd);
    DdNode      *f0, *f1, *fd, *g0, *g1, *gd;
    DdNode      *q, *tmp;
    DdNode      *r;
    DdNode      *term1, *term0, *termd;
    int         flag;
    int         pv, nv;

    statLine(dd);
    if (g == one)
        return(f);
    if (f == zero || f == one)
        return(zero);
    if (f == g)
        return(one);

    /* Check cache. */
    r = cuddCacheLookup2Zdd(dd, cuddZddWeakDivF, f, g);
    if (r)
        return(r);

    top_f = dd->permZ[f->index];
    top_g = dd->permZ[g->index];
    vf = top_f >> 1;
    vg = top_g >> 1;
    v = ddMin(top_f, top_g);

    if (v == top_f && vf < vg) {
        v = f->index;
        flag = cuddZddGetCofactors3(dd, f, v, &f1, &f0, &fd);
        if (flag == 1)
            return(NULL);
        Cudd_Ref(f1);
        Cudd_Ref(f0);
        Cudd_Ref(fd);

        pv = cuddZddGetPosVarIndex(dd, v);
        nv = cuddZddGetNegVarIndex(dd, v);

        term1 = cuddZddWeakDivF(dd, f1, g);
        if (term1 == NULL) {
            Cudd_RecursiveDerefZdd(dd, f1);
            Cudd_RecursiveDerefZdd(dd, f0);
            Cudd_RecursiveDerefZdd(dd, fd);
            return(NULL);
        }
        Cudd_Ref(term1);
        Cudd_RecursiveDerefZdd(dd, f1);
        term0 = cuddZddWeakDivF(dd, f0, g);
        if (term0 == NULL) {
            Cudd_RecursiveDerefZdd(dd, f0);
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDerefZdd(dd, term1);
            return(NULL);
        }
        Cudd_Ref(term0);
        Cudd_RecursiveDerefZdd(dd, f0);
        termd = cuddZddWeakDivF(dd, fd, g);
        if (termd == NULL) {
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDerefZdd(dd, term1);
            Cudd_RecursiveDerefZdd(dd, term0);
            return(NULL);
        }
        Cudd_Ref(termd);
        Cudd_RecursiveDerefZdd(dd, fd);

        tmp = cuddZddGetNode(dd, nv, term0, termd); /* nv = zi */
        if (tmp == NULL) {
            Cudd_RecursiveDerefZdd(dd, term1);
            Cudd_RecursiveDerefZdd(dd, term0);
            Cudd_RecursiveDerefZdd(dd, termd);
            return(NULL);
        }
        Cudd_Ref(tmp);
        Cudd_RecursiveDerefZdd(dd, term0);
        Cudd_RecursiveDerefZdd(dd, termd);
        q = cuddZddGetNode(dd, pv, term1, tmp); /* pv = yi */
        if (q == NULL) {
            Cudd_RecursiveDerefZdd(dd, term1);
            Cudd_RecursiveDerefZdd(dd, tmp);
            return(NULL);
        }
        Cudd_Ref(q);
        Cudd_RecursiveDerefZdd(dd, term1);
        Cudd_RecursiveDerefZdd(dd, tmp);

        cuddCacheInsert2(dd, cuddZddWeakDivF, f, g, q);
        Cudd_Deref(q);
        return(q);
    }

    if (v == top_f)
        v = f->index;
    else
        v = g->index;

    flag = cuddZddGetCofactors3(dd, f, v, &f1, &f0, &fd);
    if (flag == 1)
        return(NULL);
    Cudd_Ref(f1);
    Cudd_Ref(f0);
    Cudd_Ref(fd);
    flag = cuddZddGetCofactors3(dd, g, v, &g1, &g0, &gd);
    if (flag == 1) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, fd);
        return(NULL);
    }
    Cudd_Ref(g1);
    Cudd_Ref(g0);
    Cudd_Ref(gd);

    q = g;

    if (g0 != zero) {
        q = cuddZddWeakDivF(dd, f0, g0);
        if (q == NULL) {
            Cudd_RecursiveDerefZdd(dd, f1);
            Cudd_RecursiveDerefZdd(dd, f0);
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDerefZdd(dd, g1);
            Cudd_RecursiveDerefZdd(dd, g0);
            Cudd_RecursiveDerefZdd(dd, gd);
            return(NULL);
        }
        Cudd_Ref(q);
    }
    else
        Cudd_Ref(q);
    Cudd_RecursiveDerefZdd(dd, f0);
    Cudd_RecursiveDerefZdd(dd, g0);

    if (q == zero) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, gd);
        cuddCacheInsert2(dd, cuddZddWeakDivF, f, g, zero);
        Cudd_Deref(q);
        return(zero);
    }

    if (g1 != zero) {
        Cudd_RecursiveDerefZdd(dd, q);
        tmp = cuddZddWeakDivF(dd, f1, g1);
        if (tmp == NULL) {
            Cudd_RecursiveDerefZdd(dd, f1);
            Cudd_RecursiveDerefZdd(dd, g1);
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDerefZdd(dd, gd);
            return(NULL);
        }
        Cudd_Ref(tmp);
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, g1);
        if (q == g)
            q = tmp;
        else {
            q = cuddZddIntersect(dd, q, tmp);
            if (q == NULL) {
                Cudd_RecursiveDerefZdd(dd, fd);
                Cudd_RecursiveDerefZdd(dd, gd);
                return(NULL);
            }
            Cudd_Ref(q);
            Cudd_RecursiveDerefZdd(dd, tmp);
        }
    }
    else {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, g1);
    }

    if (q == zero) {
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, gd);
        cuddCacheInsert2(dd, cuddZddWeakDivF, f, g, zero);
        Cudd_Deref(q);
        return(zero);
    }

    if (gd != zero) {
        Cudd_RecursiveDerefZdd(dd, q);
        tmp = cuddZddWeakDivF(dd, fd, gd);
        if (tmp == NULL) {
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDerefZdd(dd, gd);
            return(NULL);
        }
        Cudd_Ref(tmp);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, gd);
        if (q == g)
            q = tmp;
        else {
            q = cuddZddIntersect(dd, q, tmp);
            if (q == NULL) {
                Cudd_RecursiveDerefZdd(dd, tmp);
                return(NULL);
            }
            Cudd_Ref(q);
            Cudd_RecursiveDerefZdd(dd, tmp);
        }
    }
    else {
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, gd);
    }

    cuddCacheInsert2(dd, cuddZddWeakDivF, f, g, q);
    Cudd_Deref(q);
    return(q);

}